

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallBinary(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  TestStruct theStruct;
  char *local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  JlMarshallElement marshalTestStruct [2];
  JlMarshallElement marshalTestStruct2 [3];
  
  memcpy(marshalTestStruct,&DAT_00142550,0xc0);
  theStruct.FixedBlob[0] = '\0';
  theStruct.FixedBlob[1] = '\0';
  theStruct.FixedBlob[2] = '\0';
  theStruct.FixedBlob[3] = '\0';
  theStruct.FixedBlob[4] = '\0';
  theStruct.FixedBlob[5] = '\0';
  theStruct.FixedBlob[6] = '\0';
  theStruct.FixedBlob[7] = '\0';
  theStruct.FixedBlob[8] = '\0';
  theStruct.FixedBlob[9] = '\0';
  theStruct._10_6_ = 0;
  theStruct.BinaryBlob2 = 0;
  WVar1 = MakeJson5AndVerify(&theStruct,marshalTestStruct,2,
                             "{FixedBlob:\'AAAAAAAAAAAAAA\',BinaryBlob2:\'AAAAAAAAAAA\'}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), \"{FixedBlob:\'AAAAAAAAAAAAAA\',BinaryBlob2:\'AAAAAAAAAAA\'}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x29e);
  builtin_memcpy(theStruct.FixedBlob,"ThisIsTe",8);
  theStruct.FixedBlob[8] = 's';
  theStruct.FixedBlob[9] = 't';
  theStruct.BinaryBlob2 = 0x123456789abcdef0;
  WVar2 = MakeJson5AndVerify(&theStruct,marshalTestStruct,2,
                             "{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), \"{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x2a4);
  memcpy(marshalTestStruct2,&DAT_00142610,0x120);
  local_228 = 0;
  uStack_220 = 0;
  local_248 = "1234567890";
  local_240 = 10;
  local_238 = "1234567890AAAABBBBCCCCDDDD";
  local_230 = 0x1a;
  WVar3 = MakeJson5AndVerify(&local_248,marshalTestStruct2,3,
                             "{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}"
                            );
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct2, marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x2c0);
  WVar4 = WJTL_STATUS_FAILED;
  if ((WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) && WVar3 == WJTL_STATUS_SUCCESS
     ) {
    WVar4 = WJTL_STATUS_SUCCESS;
  }
  return WVar4;
}

Assistant:

static
WJTL_STATUS
    TestMarshallBinary
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t     FixedBlob[10];      // Treat as 80bit binary
        uint64_t    BinaryBlob2;        // Treat as 64bit binary
    } TestStruct;

    JlMarshallElement marshalTestStruct[] =
    {
        JlMarshallBinaryFixed( TestStruct, FixedBlob, "FixedBlob" ),
        JlMarshallBinaryFixed( TestStruct, BinaryBlob2, "BinaryBlob2" ),
    };

    TestStruct theStruct = {{0}};

    // Check marshalling zero values
    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalTestStruct, NumElements(marshalTestStruct),
                                          "{FixedBlob:'AAAAAAAAAAAAAA',BinaryBlob2:'AAAAAAAAAAA'}" ) );

    // Check other values
    memcpy( theStruct.FixedBlob, "ThisIsTest", 10 );
    theStruct.BinaryBlob2 = 0x123456789ABCDEF0ULL;
    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalTestStruct, NumElements(marshalTestStruct),
                                          "{FixedBlob:'VGhpc0lzVGVzdA',BinaryBlob2:'8N68mnhWNBI'}" ) );

    // Now Test with variable sized binary
    typedef struct
    {
        uint8_t*    VariableBlob1;
        size_t      VariableBlob1Size;
        void*       VariableBlob2;
        size_t      VariableBlob2Size;
        uint32_t*   VariableBlob3;
        size_t      VariableBlob3Size;
    } TestStruct2;

    JlMarshallElement marshalTestStruct2[] =
    {
        JlMarshallBinary( TestStruct2, VariableBlob1, VariableBlob1Size, "VariableBlob1" ),
        JlMarshallBinary( TestStruct2, VariableBlob2, VariableBlob2Size, "VariableBlob2" ),
        JlMarshallBinary( TestStruct2, VariableBlob3, VariableBlob3Size, "VariableBlob3" ),
    };

    TestStruct2 theStruct2 = {0};
    theStruct2.VariableBlob1 = (uint8_t*) "1234567890";
    theStruct2.VariableBlob1Size = 10;
    theStruct2.VariableBlob2 = "1234567890AAAABBBBCCCCDDDD";
    theStruct2.VariableBlob2Size = 26;

    JL_ASSERT_SUCCESS( MakeJson5AndVerify(
        &theStruct2, marshalTestStruct2, NumElements(marshalTestStruct2),
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ',VariableBlob3:null}" ) );

    return TestReturn;
}